

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDeep.c
# Opt level: O0

Gia_Man_t * Gia_ManDeepSynOne(int nNoImpr,int TimeOut,int nAnds,int Seed,int fUseTwo,int fVerbose)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Abc_Frame_t *pAVar7;
  Gia_Man_t *pGVar8;
  abctime aVar9;
  char *pcVar10;
  char *pcVar11;
  uint local_47c;
  long local_478;
  char *local_470;
  char *pComp;
  char Command [1000];
  int fChange;
  int KLut;
  int fFx;
  int fCom;
  int fDch;
  uint Rand;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  int iIterLast;
  int nAndsMin;
  int IterMax;
  int i;
  int s;
  abctime clkStart;
  abctime nTimeToStop;
  int fVerbose_local;
  int fUseTwo_local;
  int Seed_local;
  int nAnds_local;
  int TimeOut_local;
  int nNoImpr_local;
  
  if (TimeOut == 0) {
    local_478 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    local_478 = aVar6 + (long)TimeOut * 1000000;
  }
  aVar6 = Abc_Clock();
  pTemp._4_4_ = -1;
  pAVar7 = Abc_FrameGetGlobalFrame();
  pGVar8 = Abc_FrameReadGia(pAVar7);
  _fDch = Gia_ManDup(pGVar8);
  Abc_Random(1);
  for (IterMax = 0; IterMax < Seed + 10; IterMax = IterMax + 1) {
    Abc_Random(0);
  }
  nAndsMin = 0;
  do {
    if (99999 < nAndsMin) {
LAB_00935cad:
      if (nAndsMin == 100000) {
        aVar9 = Abc_Clock();
        printf("Iteration limit (%d iters) is reached after %.2f seconds.\n",
               (double)(((float)(aVar9 - aVar6) * 1.0) / 1e+06),100000);
      }
      else if ((nAnds != 0) && (-2 < nAnds)) {
        aVar9 = Abc_Clock();
        printf("Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n"
               ,(double)(((float)(aVar9 - aVar6) * 1.0) / 1e+06),0xffffffff,(ulong)(uint)nAnds,
               (ulong)(uint)nAndsMin);
      }
      return _fDch;
    }
    uVar2 = Abc_Random(0);
    uVar3 = uVar2 >> 1 & 1;
    if (fUseTwo == 0) {
      local_47c = nAndsMin % 4 + 3;
    }
    else {
      local_47c = nAndsMin % 5 + 2;
    }
    local_470 = (char *)0x0;
    if (uVar3 == 3) {
      local_470 = "; &put; compress2rs; compress2rs; compress2rs; &get";
    }
    else if (uVar3 == 2) {
      local_470 = "; &put; compress2rs; compress2rs; &get";
    }
    else if (uVar3 == 1) {
      local_470 = "; &put; compress2rs; &get";
    }
    else if (uVar3 == 0) {
      local_470 = "; &dc2";
    }
    pcVar10 = "";
    if ((uVar2 & 1) != 0) {
      pcVar10 = " -f";
    }
    pcVar11 = "";
    if ((uVar2 >> 2 & 1) != 0) {
      pcVar11 = "; &fx";
    }
    sprintf((char *)&pComp,"&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",pcVar10,(ulong)local_47c,
            pcVar11,local_470);
    pAVar7 = Abc_FrameGetGlobalFrame();
    iVar4 = Cmd_CommandExecute(pAVar7,(char *)&pComp);
    if (iVar4 != 0) {
      Abc_Print(1,"Something did not work out with the command \"%s\".\n",&pComp);
      return (Gia_Man_t *)0x0;
    }
    pAVar7 = Abc_FrameGetGlobalFrame();
    pGVar8 = Abc_FrameReadGia(pAVar7);
    iVar4 = Gia_ManAndNum(_fDch);
    iVar5 = Gia_ManAndNum(pGVar8);
    if (iVar4 <= iVar5) {
      Gia_ManAndNum(_fDch);
      Gia_ManAndNum(_fDch);
      Gia_ManAndNum(pGVar8);
    }
    else {
      Gia_ManStop(_fDch);
      _fDch = Gia_ManDup(pGVar8);
      pTemp._4_4_ = nAndsMin;
    }
    bVar1 = iVar4 > iVar5;
    if ((bVar1) && (fVerbose != 0)) {
      printf("Iter %6d : ",(ulong)(uint)nAndsMin);
      aVar9 = Abc_Clock();
      printf("Time %8.2f sec : ",(double)(((float)(aVar9 - aVar6) * 1.0) / 1e+06));
      uVar2 = Gia_ManAndNum(_fDch);
      printf("And = %6d  ",(ulong)uVar2);
      uVar2 = Gia_ManLevelNum(_fDch);
      printf("Lev = %3d  ",(ulong)uVar2);
      if (bVar1) {
        printf("<== best : ");
      }
      else if (fVerbose != 0) {
        printf("           ");
      }
      printf("%s",&pComp);
      printf("\n");
    }
    if ((local_478 != 0) && (aVar9 = Abc_Clock(), local_478 < aVar9)) {
      printf("Runtime limit (%d sec) is reached after %d iterations.\n",(ulong)(uint)TimeOut,
             (ulong)(uint)nAndsMin);
      goto LAB_00935cad;
    }
    if (nNoImpr < nAndsMin - pTemp._4_4_) {
      aVar9 = Abc_Clock();
      printf("Completed %d iterations without improvement in %.2f seconds.\n",
             (double)(((float)(aVar9 - aVar6) * 1.0) / 1e+06),(ulong)(uint)nNoImpr);
      goto LAB_00935cad;
    }
    nAndsMin = nAndsMin + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDeepSynOne( int nNoImpr, int TimeOut, int nAnds, int Seed, int fUseTwo, int fVerbose )
{
    abctime nTimeToStop = TimeOut ? Abc_Clock() + TimeOut * CLOCKS_PER_SEC : 0;
    abctime clkStart    = Abc_Clock();
    int s, i, IterMax   = 100000, nAndsMin = -1, iIterLast = -1;
    Gia_Man_t * pTemp   = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
    Gia_Man_t * pNew    = Gia_ManDup( pTemp );
    Abc_Random(1);
    for ( s = 0; s < 10+Seed; s++ )
        Abc_Random(0);
    for ( i = 0; i < IterMax; i++ )
    {
        unsigned Rand = Abc_Random(0);
        int fDch = Rand & 1;
        //int fCom = (Rand >> 1) & 3;
        int fCom = (Rand >> 1) & 1;
        int fFx  = (Rand >> 2) & 1;
        int KLut = fUseTwo ? 2 + (i % 5) : 3 + (i % 4);
        int fChange = 0;
        char Command[1000];
        char * pComp = NULL;
        if ( fCom == 3 )
            pComp = "; &put; compress2rs; compress2rs; compress2rs; &get";
        else if ( fCom == 2 )
            pComp = "; &put; compress2rs; compress2rs; &get";
        else if ( fCom == 1 )
            pComp = "; &put; compress2rs; &get";
        else if ( fCom == 0 )
            pComp = "; &dc2";
        sprintf( Command, "&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",
            fDch ? " -f" : "", KLut, fFx ? "; &fx" : "", pComp );
        if ( Cmd_CommandExecute(Abc_FrameGetGlobalFrame(), Command) )
        {
            Abc_Print( 1, "Something did not work out with the command \"%s\".\n", Command );
            return NULL;
        }
        pTemp = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
        if ( Gia_ManAndNum(pNew) > Gia_ManAndNum(pTemp) )
        {
            Gia_ManStop( pNew );
            pNew = Gia_ManDup( pTemp );
            fChange = 1;
            iIterLast = i;
        }
        else if ( Gia_ManAndNum(pNew) + Gia_ManAndNum(pNew)/10 < Gia_ManAndNum(pTemp) ) 
        {
            //printf( "Updating\n" );
            //Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), Gia_ManDup(pNew) );
        }
        if ( fChange && fVerbose )
        {
            printf( "Iter %6d : ", i );
            printf( "Time %8.2f sec : ", (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            printf( "And = %6d  ", Gia_ManAndNum(pNew) );
            printf( "Lev = %3d  ", Gia_ManLevelNum(pNew) );
            if ( fChange ) 
                printf( "<== best : " );
            else if ( fVerbose )
                printf( "           " );
            printf( "%s", Command );
            printf( "\n" );
        }
        if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        {
            printf( "Runtime limit (%d sec) is reached after %d iterations.\n", TimeOut, i );
            break;
        }
        if ( i - iIterLast > nNoImpr )
        {
            printf( "Completed %d iterations without improvement in %.2f seconds.\n", 
                nNoImpr, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            break;
        }
    }
    if ( i == IterMax )
        printf( "Iteration limit (%d iters) is reached after %.2f seconds.\n", IterMax, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    else if ( nAnds && nAndsMin <= nAnds )
        printf( "Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n", 
            nAndsMin, nAnds, i, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    return pNew;
}